

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

Mpm_Cut_t * Mpm_ManMergeCuts(Mpm_Man_t *p,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2)

{
  Mpm_Cut_t *pNew;
  void *__dest;
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Mpm_Cut_t *pMVar15;
  ulong uVar16;
  
  pvVar9 = Vec_PtrEntryLast(&p->vFreeUnits);
  pNew = (Mpm_Cut_t *)((long)pvVar9 + 0x1c);
  __dest = (void *)((long)pvVar9 + 0x24);
  memcpy(__dest,pCut0->pLeaves,(ulong)(*(uint *)&pCut0->field_0x4 >> 0x19 & 0xfffffffc));
  *(uint *)((long)pvVar9 + 0x20) =
       *(uint *)((long)pvVar9 + 0x20) & 0x7ffffff | *(uint *)&pCut0->field_0x4 & 0xf8000000;
  if (p->pPars->fUseDsd == 0) {
    for (iVar6 = 1; iVar6 != 3; iVar6 = iVar6 + 1) {
      pMVar15 = pCut2;
      if (iVar6 == 1) {
        pMVar15 = pCut1;
      }
      if (pMVar15 == (Mpm_Cut_t *)0x0) break;
      for (uVar16 = 0; uVar16 < *(uint *)&pMVar15->field_0x4 >> 0x1b; uVar16 = uVar16 + 1) {
        iVar8 = Abc_Lit2Var(pMVar15->pLeaves[uVar16]);
        uVar7 = Mpm_CutFindLeaf(pNew,iVar8);
        if (uVar7 == *(uint *)((long)pvVar9 + 0x20) >> 0x1b) {
          if (uVar7 == p->nLutSize) {
            return (Mpm_Cut_t *)0x0;
          }
          iVar8 = pMVar15->pLeaves[uVar16];
          *(uint *)((long)pvVar9 + 0x20) = *(uint *)((long)pvVar9 + 0x20) + 0x8000000;
          *(int *)((long)pvVar9 + (ulong)uVar7 * 4 + 0x24) = iVar8;
        }
      }
    }
  }
  else {
    for (lVar12 = 1; lVar12 != 3; lVar12 = lVar12 + 1) {
      pMVar15 = pCut2;
      if (lVar12 == 1) {
        pMVar15 = pCut1;
      }
      if (pMVar15 == (Mpm_Cut_t *)0x0) break;
      p->uPermMask[lVar12] = 0x3ffff;
      p->uComplMask[lVar12] = 0;
      for (uVar16 = 0; uVar16 < *(uint *)&pMVar15->field_0x4 >> 0x1b; uVar16 = uVar16 + 1) {
        iVar6 = Abc_Lit2Var(pMVar15->pLeaves[uVar16]);
        uVar7 = Mpm_CutFindLeaf(pNew,iVar6);
        if (uVar7 == *(uint *)((long)pvVar9 + 0x20) >> 0x1b) {
          if (uVar7 == p->nLutSize) {
            return (Mpm_Cut_t *)0x0;
          }
          iVar6 = pMVar15->pLeaves[uVar16];
          *(uint *)((long)pvVar9 + 0x20) = *(uint *)((long)pvVar9 + 0x20) + 0x8000000;
          *(int *)((long)pvVar9 + (ulong)uVar7 * 4 + 0x24) = iVar6;
        }
        p->uPermMask[lVar12] =
             p->uPermMask[lVar12] ^ (~(uint)uVar16 & 7) << ((byte)uVar7 * '\x03' & 0x1f);
        if (pMVar15->pLeaves[uVar16] != *(int *)((long)__dest + (long)(int)uVar7 * 4)) {
          p->uComplMask[lVar12] = p->uComplMask[lVar12] | 1 << ((byte)uVar7 & 0x1f);
        }
      }
    }
  }
  pNew->hNext = 0;
  if (pCut1 == (Mpm_Cut_t *)0x0) {
    uVar10 = *(uint *)&pCut0->field_0x4 & 0x1ffffff;
    uVar7 = *(uint *)((long)pvVar9 + 0x20);
    *(uint *)((long)pvVar9 + 0x20) = uVar7 & 0xfe000000 | uVar10;
    uVar11 = *(uint *)&pCut0->field_0x4 & 0x4000000;
    *(uint *)((long)pvVar9 + 0x20) = uVar7 & 0xfa000000 | uVar10 | uVar11;
    uVar7 = uVar7 & 0xf8000000 | uVar10 | uVar11 | *(uint *)&pCut0->field_0x4 & 0x2000000;
  }
  else {
    uVar7 = *(uint *)((long)pvVar9 + 0x20) & 0xf8000000 | 0x1ffffff;
  }
  *(uint *)((long)pvVar9 + 0x20) = uVar7;
  uVar2 = p->nCutsMerged;
  uVar3 = p->nCutsMergedAll;
  p->nCutsMerged = uVar2 + 1;
  p->nCutsMergedAll = uVar3 + 1;
  if (p->pPars->fUseTruth != 0) {
    uVar7 = *(uint *)((long)pvVar9 + 0x20) >> 0x1b;
    for (uVar16 = 0; uVar16 != (uVar7 - 1) + (uint)(uVar7 == 0); uVar16 = uVar16 + 1) {
      uVar13 = uVar16;
      uVar5 = uVar16 & 0xffffffff;
      while (uVar14 = uVar5, lVar12 = (long)(int)uVar14, (ulong)uVar7 - 1 != uVar13) {
        lVar1 = uVar13 * 4;
        uVar13 = uVar13 + 1;
        uVar5 = uVar13 & 0xffffffff;
        if (*(int *)((long)pvVar9 + lVar12 * 4 + 0x24) <= *(int *)((long)pvVar9 + lVar1 + 0x28)) {
          uVar5 = uVar14;
        }
      }
      uVar4 = *(undefined4 *)((long)__dest + uVar16 * 4);
      *(undefined4 *)((long)__dest + uVar16 * 4) = *(undefined4 *)((long)__dest + lVar12 * 4);
      *(undefined4 *)((long)__dest + lVar12 * 4) = uVar4;
    }
  }
  return pNew;
}

Assistant:

static inline Mpm_Cut_t * Mpm_ManMergeCuts( Mpm_Man_t * p, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2 )
{
    Mpm_Cut_t * pTemp, * pCut = &((Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits))->pCut;
    int i, c, iPlace;
    // base cut
    memcpy( pCut->pLeaves, pCut0->pLeaves, sizeof(int) * pCut0->nLeaves );
    pCut->nLeaves = pCut0->nLeaves;
    // remaining cuts
    if ( p->pPars->fUseDsd )
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            p->uPermMask[c] = 0x3FFFF; // 18 bits
            p->uComplMask[c] = 0;     
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
                p->uPermMask[c] ^= (((i & 7) ^ 7) << (3*iPlace));
                if ( pTemp->pLeaves[i] != pCut->pLeaves[iPlace] )
                    p->uComplMask[c] |= (1 << iPlace);
            }
        }
    }
    else
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
            }
        }
    }
    if ( pCut1 == NULL )
    {
        pCut->hNext    = 0;
        pCut->iFunc    = pCut0->iFunc;
        pCut->fUseless = pCut0->fUseless;
        pCut->fCompl   = pCut0->fCompl;
    }
    else
    {
        pCut->hNext    = 0;
        pCut->iFunc    = 0;  pCut->iFunc = ~pCut->iFunc;
        pCut->fUseless = 0;
        pCut->fCompl   = 0;
    }
    p->nCutsMerged++;
    p->nCutsMergedAll++;
    if ( p->pPars->fUseTruth )
        Vec_IntSelectSort( pCut->pLeaves, pCut->nLeaves );
    return pCut;
}